

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O0

bool shm::move_to_tid_numa(pid_t thread_id,void *ptr,size_t nbytes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  ostream *poVar5;
  TemplateSHMException<2> *this;
  cpu_set_t *__cpuset;
  size_t __n;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  void *pvVar9;
  void *__ptr;
  bool bVar10;
  double dVar11;
  float local_288;
  int local_268;
  int local_264;
  int page_index;
  int node_index;
  char *temp_ptr;
  void **page_ptr;
  int_t *mem_status;
  int_t *mem_node;
  size_t num_pages;
  int target_node;
  int ret_val;
  size_t __cpu;
  int local_218;
  int p_index;
  int denom;
  int numa_node_count;
  size_t cpu_allocate_size;
  int num_cpus_alloc;
  cpu_set_t *cpuset;
  int local_node;
  bool moved;
  int num_numa;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  ulong local_30;
  uintptr_t ptr_addr;
  long page_size;
  size_t nbytes_local;
  void *ptr_local;
  pid_t thread_id_local;
  
  page_size = nbytes;
  nbytes_local = (size_t)ptr;
  ptr_local._0_4_ = thread_id;
  ptr_addr = sysconf(0x1e);
  local_30 = nbytes_local;
  if (nbytes_local % ptr_addr != 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar5 = std::operator<<(local_1a8,"Variable \'ptr\' must be page aligned, currently it is(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_30 % ptr_addr);
    std::operator<<(poVar5,"), off please fix...exiting!!\n");
    this = (TemplateSHMException<2> *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    TemplateSHMException<2>::TemplateSHMException(this,(string *)&num_numa);
    __cxa_throw(this,&TemplateSHMException<2>::typeinfo,
                TemplateSHMException<2>::~TemplateSHMException);
  }
  iVar3 = numa_available();
  if (iVar3 == -1) {
    ptr_local._7_1_ = true;
  }
  else {
    iVar3 = numa_num_configured_nodes();
    if (iVar3 == 1) {
      ptr_local._7_1_ = true;
    }
    else {
      iVar3 = sched_getcpu();
      numa_node_of_cpu(iVar3);
      iVar3 = get_nprocs_conf();
      __cpuset = __sched_cpualloc((long)iVar3);
      if (__cpuset == (cpu_set_t *)0x0) {
        __assert_fail("cpuset != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/RaftLib[P]shm/lib/shm.cpp"
                      ,0x290,
                      "static bool shm::move_to_tid_numa(const pid_t, void *, const std::size_t)");
      }
      __n = ((long)iVar3 + 0x3fU >> 6) << 3;
      memset(__cpuset,0,__n);
      iVar4 = sched_getaffinity((pid_t)ptr_local,__n,__cpuset);
      if (iVar4 == 0) {
        p_index = 0;
        local_218 = 0;
        for (__cpu._4_4_ = 0; __cpu._4_4_ < iVar3; __cpu._4_4_ = __cpu._4_4_ + 1) {
          if ((ulong)(long)__cpu._4_4_ >> 3 < 0x80) {
            bVar10 = (__cpuset->__bits[(ulong)(long)__cpu._4_4_ >> 6] &
                     1L << ((byte)__cpu._4_4_ & 0x3f)) != 0;
          }
          else {
            bVar10 = false;
          }
          if ((bVar10) && (iVar4 = numa_node_of_cpu(__cpu._4_4_), iVar4 != -1)) {
            p_index = iVar4 + p_index;
            local_218 = local_218 + 1;
          }
        }
        local_288 = (float)(ulong)page_size;
        dVar11 = std::ceil((double)(ulong)(uint)(local_288 / (float)(long)ptr_addr));
        uVar6 = (ulong)SUB84(dVar11,0);
        uVar6 = uVar6 | (long)(SUB84(dVar11,0) - 9.223372e+18) & (long)uVar6 >> 0x3f;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar6;
        uVar7 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar7 = 0xffffffffffffffff;
        }
        pvVar8 = operator_new__(uVar7);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar6;
        uVar7 = SUB168(auVar2 * ZEXT816(4),0);
        if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
          uVar7 = 0xffffffffffffffff;
        }
        pvVar9 = operator_new__(uVar7);
        __ptr = malloc(uVar6 << 3);
        local_268 = 0;
        for (local_264 = 0; (ulong)(long)local_264 < uVar6; local_264 = local_264 + 1) {
          *(int *)((long)pvVar8 + (long)local_264 * 4) = p_index / local_218;
          *(undefined4 *)((long)pvVar9 + (long)local_264 * 4) = 0xffffffff;
          *(size_t *)((long)__ptr + (long)local_264 * 8) = nbytes_local + (long)local_268;
          local_268 = local_268 + (int)ptr_addr;
        }
        move_pages((pid_t)ptr_local,uVar6,__ptr,pvVar8,pvVar9,2);
        if (pvVar8 != (void *)0x0) {
          operator_delete__(pvVar8);
        }
        if (pvVar9 != (void *)0x0) {
          operator_delete__(pvVar9);
        }
        free(__ptr);
        ptr_local._7_1_ = false;
      }
      else {
        perror("Failed to get affinity for calling thread!");
        ptr_local._7_1_ = false;
      }
    }
  }
  return ptr_local._7_1_;
}

Assistant:

bool
shm::move_to_tid_numa( const pid_t thread_id,
                       void *ptr,
                       const std::size_t nbytes )
{
#if __linux && ( PLATFORM_HAS_NUMA == 1 )
   /** check alignment of pages first **/
   const auto page_size( sysconf( _SC_PAGESIZE ) );
   
   const auto ptr_addr( 
      reinterpret_cast< std::uintptr_t >( ptr ) );
   if( (ptr_addr % page_size) != 0 )
   {
#if USE_CPP_EXCEPTIONS==1      
      std::stringstream ss;
      ss << "Variable 'ptr' must be page aligned, currently it is(" << 
       ptr_addr % page_size << "), off please fix...exiting!!\n";
      throw page_alignment_exception( ss.str() );
#else
      return( false );
#endif
   }

   /** check to see if NUMA avail **/
   if( numa_available() == -1 )
   {
      return( true );
   }
   /** first check to see if there is more than one numa node **/
   const auto num_numa( numa_num_configured_nodes() );
   if( num_numa == 1 )
   {
      /** no point in continuing **/
      return( true );
   }

   /** RETURN VAL HERE */
   bool moved( false );
   /** get the numa node of the calling thread **/
   const auto local_node( numa_node_of_cpu( sched_getcpu() ) );      
   /** get numa node that 'pages' is on **/
   /**
    * Note: only way I could figure out how to do this was get a cpu
    * set, we'll check to see how many CPU's are in the CPU set of 
    * the thread, then we'll see if all those CPU's are on the 
    * same NUMA node, if they are then we'll check to see if the
    * alloc is on the same node, otherwise we'll move the pages to that
    * node.  The interesting case comes when there are multiple
    * CPUs per set and multiple possible NUMA nodes to choose from.  The simple
    * answer, the one I'm taking a the moment is that we can't 
    * really decide in this function.  I think in the future it'd
    * be good to have a profiler decide the shortest latency and
    * highest bandwidth for long running programs at startup and 
    * do some sort of graph matching.
    */
   cpu_set_t *cpuset( nullptr );
   /** we want set to include all cpus **/
   const auto num_cpus_alloc( get_nprocs_conf() );
   std::size_t cpu_allocate_size( -1 );
#if (__GLIBC_MINOR__ > 9 ) && (__GLIBC__ == 2)
   cpuset = CPU_ALLOC( num_cpus_alloc );
   assert( cpuset != nullptr );
   cpu_allocate_size = CPU_ALLOC_SIZE( num_cpus_alloc );
   CPU_ZERO_S( cpu_allocate_size, cpuset );
#else
   cpu_allocate_size = sizeof( cpu_set_t );
   cpuset = reinterpret_cast< cpu_set_t* >( malloc( cpu_allocate_size ) );
   assert( cpuset != nullptr );
   CPU_ZERO( cpuset );
#endif
   /** now get affinity **/
   if( sched_getaffinity( thread_id, cpu_allocate_size, cpuset ) != 0 )
   {
      perror( "Failed to get affinity for calling thread!" );
      return( false );
   }
   /**
    * NOTE: for the moment we're using an extremely simplistic
    * distance metric, we should probably be using the numa_distance
    * combined with the actual latancy/bandwidth between the 
    * processor cores.
    */
   auto numa_node_count( 0 );
   auto denom( 0 );
   for( auto p_index( 0 ); p_index < num_cpus_alloc; p_index++ )
   {
      if( CPU_ISSET( p_index /* cpu */, cpuset ) )
      {
         const auto ret_val( numa_node_of_cpu( p_index ) );
         if( ret_val != -1 )
         {
            numa_node_count += ret_val;
            denom++;
         }
      }
   }
   const auto target_node( numa_node_count / denom );

   /** we need to know how many pages we have **/
   const auto num_pages(
      static_cast< std::size_t >(
      std::ceil( 
      static_cast< float >( nbytes ) / static_cast< float >( page_size ) ) ) );
   using int_t = std::int32_t;
   int_t *mem_node  ( new int_t[ num_pages ] );
   int_t *mem_status( new int_t[ num_pages ] );
   void **page_ptr = (void**)malloc( sizeof( void* ) * num_pages );
   char *temp_ptr( reinterpret_cast< char* >( ptr ) );
   for( auto node_index( 0 ), 
             page_index( 0 )                       /** init **/; 
             node_index < num_pages                /** cond **/; 
             node_index++, page_index += page_size /** incr **/)
   {
      mem_node  [ node_index ] = target_node;
      mem_status[ node_index ] = -1;
      page_ptr[ node_index ] = (void*)&temp_ptr[ page_index ];
   }
   if( move_pages(   thread_id /** thread we want to move for **/,
                     num_pages /** total number of pages **/,
                     page_ptr  /** pointers to the start of each page **/,
                     mem_node  /** node we want to move to **/,
                     mem_status/** status flags, check for debug **/,
                     MPOL_MF_MOVE ) != 0 )
   {
#if DEBUG
      perror( "failed to move pages, non-fatal error but results may vary.");
      /** TODO, re-code all status flag checks..accidentally over wrote **/
#endif
      moved = false;
   }
   delete[]( mem_node );
   delete[]( mem_status );
   free( page_ptr );
   return( moved );
#else /** no NUMA avail **/
   return( false );
#endif
}